

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

void __thiscall
booster::aio::stream_socket::async_read_some
          (stream_socket *this,mutable_buffer *buffer,io_handler *h)

{
  atomic_counter *this_00;
  reader_some *prVar1;
  bool bVar2;
  size_t n;
  pointer_type this_01;
  io_service *this_02;
  error_code e;
  event_handler local_48;
  error_code local_40;
  
  bVar2 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar2) {
    local_40._M_value = 0;
    local_40._M_cat = (error_category *)std::_V2::system_category();
    n = read_some(this,buffer,&local_40);
    if ((local_40._M_value != 0) && (bVar2 = basic_io_device::would_block(&local_40), bVar2)) {
      this_01.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x50);
      ((this_01.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_001cef10;
      this_00 = &((this_01.p_)->super_refcounted).refs_;
      atomic_counter::atomic_counter(this_00,0);
      ((this_01.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__reader_some_001cf360;
      prVar1 = (reader_some *)(h->call_ptr).p_;
      this_01.p_[1].super_refcounted._vptr_refcounted = (_func_int **)prVar1;
      if (prVar1 != (reader_some *)0x0) {
        atomic_counter::inc(&(prVar1->super_callable<void_(const_std::error_code_&)>).
                             super_refcounted.refs_);
      }
      this_01.p_[2].super_refcounted.refs_.value_.super___atomic_base<long>._M_i =
           (buffer->super_buffer_impl<char_*>).entry_.size;
      prVar1 = (reader_some *)(buffer->super_buffer_impl<char_*>).entry_.ptr;
      this_01.p_[1].super_refcounted.refs_.value_.super___atomic_base<long>._M_i =
           *(__int_type *)&buffer->super_buffer_impl<char_*>;
      this_01.p_[2].super_refcounted._vptr_refcounted = (_func_int **)prVar1;
      std::
      vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ::vector((vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                *)(this_01.p_ + 3),&(buffer->super_buffer_impl<char_*>).vec_);
      this_01.p_[4].super_refcounted.refs_.value_.super___atomic_base<long>._M_i = (__int_type)this;
      atomic_counter::inc(this_00);
      atomic_counter::inc(this_00);
      local_48.call_ptr.p_ = (pointer_type)(pointer_type)this_01.p_;
      atomic_counter::inc(this_00);
      basic_io_device::on_readable((basic_io_device *)this,&local_48);
      intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                (&local_48.call_ptr);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::~intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> *)this_01.p_);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::~intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> *)this_01.p_);
      return;
    }
    this_02 = basic_io_device::get_io_service((basic_io_device *)this);
    io_service::post(this_02,h,&local_40,n);
  }
  return;
}

Assistant:

void stream_socket::async_read_some(mutable_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;
	#ifdef BOOSTER_AIO_FORCE_POLL
	reader_some::pointer reader(new reader_some(h,buffer,this));
	on_readable(reader);
	#else
	system::error_code e;
	size_t n = read_some(buffer,e);
	if(e &&  would_block(e)) {
		reader_some::pointer reader(new reader_some(h,buffer,this));
		on_readable(reader);
	}
	else {
		get_io_service().post(h,e,n);
	}
	#endif
}